

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

int __thiscall
TPZFYsmpMatrix<std::complex<double>_>::Decompose_LU(TPZFYsmpMatrix<std::complex<double>_> *this)

{
  long lVar1;
  long sourcerow;
  long lVar2;
  long destrow;
  
  lVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if (1 < lVar1) {
    destrow = 1;
    do {
      if ((destrow <= (this->fJA).fStore[(this->fIA).fStore[destrow + 1] + -1]) &&
         (sourcerow = *(this->fJA).fStore, sourcerow < destrow)) {
        lVar2 = 8;
        do {
          RowLUUpdate(this,sourcerow,destrow);
          sourcerow = *(long *)((long)(this->fJA).fStore + lVar2);
          lVar2 = lVar2 + 8;
        } while (sourcerow < destrow);
      }
      destrow = destrow + 1;
    } while (destrow != lVar1);
  }
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\x01';
  return 1;
}

Assistant:

int TPZFYsmpMatrix<TVar>::Decompose_LU()
{
    
#ifdef USING_MKL
    if(this->IsDecomposed() == ELU) return 1;
    if (this->IsDecomposed() != ENoDecompose) {
        DebugStop();
    }
	typename TPZPardisoSolver<TVar>::MStructure str =
        this->IsSymmetric() ?
		TPZPardisoSolver<TVar>::MStructure::ESymmetric:
		TPZPardisoSolver<TVar>::MStructure::ENonSymmetric;
	typename TPZPardisoSolver<TVar>::MSystemType sysType =
		this->IsSymmetric() ?
		TPZPardisoSolver<TVar>::MSystemType::ESymmetric:
		TPZPardisoSolver<TVar>::MSystemType::ENonSymmetric;
	typename TPZPardisoSolver<TVar>::MProperty prop =
		this->IsDefPositive() ?
		TPZPardisoSolver<TVar>::MProperty::EPositiveDefinite:
		TPZPardisoSolver<TVar>::MProperty::EIndefinite;
	fPardisoControl.SetStructure(str);
	fPardisoControl.SetMatrixType(sysType,prop);
    fPardisoControl.Decompose(this);
    this->SetIsDecomposed(ELU);
    return 1;
#endif
    
	int64_t row;
	int64_t neq = this->Rows();
	for(row=1; row<neq; row++)
	{
		//    int firstcol = fIA[row];
		int64_t lastcol = fIA[row+1];
		int64_t colind = 0;
		if(fJA[lastcol-1] < row) continue;
		while(fJA[colind] < row)
		{
			RowLUUpdate(fJA[colind],row);
			colind++;
		}
	}
	this->fDecomposed=1;
	return 1;
}